

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skip_suite.cpp
# Opt level: O0

void fail_comma_after_primitive(void)

{
  view_type vVar1;
  undefined4 local_1a0 [2];
  undefined4 local_198;
  value local_194 [5];
  size_t local_180;
  view_type skipped;
  error_code ec;
  undefined1 local_150 [8];
  reader reader;
  
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&ec._M_cat,"false,");
  trial::protocol::json::basic_reader<char>::basic_reader
            ((basic_reader<char> *)local_150,(view_type *)&ec._M_cat);
  std::error_code::error_code((error_code *)&skipped._M_str);
  vVar1 = trial::protocol::json::partial::skip<char>
                    ((basic_reader<char> *)local_150,(error_code *)&skipped._M_str);
  skipped._M_len = (size_t)vVar1._M_str;
  local_180 = vVar1._M_len;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[6]>
            ("skipped","\"false\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/skip_suite.cpp"
             ,0x8e,"void fail_comma_after_primitive()",&local_180,"false");
  local_194[0] = trial::protocol::json::basic_reader<char>::symbol((basic_reader<char> *)local_150);
  local_198 = 1;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::symbol::value,trial::protocol::json::token::symbol::value>
            ("reader.symbol()","token::symbol::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/skip_suite.cpp"
             ,0x8f,"void fail_comma_after_primitive()",local_194,&local_198);
  local_1a0[0] = 1;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::error_code,trial::protocol::json::errc>
            ("ec","json::errc::unexpected_token",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/skip_suite.cpp"
             ,0x90,"void fail_comma_after_primitive()",&skipped._M_str,local_1a0);
  trial::protocol::json::basic_reader<char>::~basic_reader((basic_reader<char> *)local_150);
  return;
}

Assistant:

void fail_comma_after_primitive()
{
    json::reader reader("false,");
    std::error_code ec;
    auto skipped = json::partial::skip(reader, ec);
    TRIAL_PROTOCOL_TEST_EQUAL(skipped, "false");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.symbol(), token::symbol::error);
    TRIAL_PROTOCOL_TEST_EQUAL(ec, json::errc::unexpected_token);
}